

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O1

void crash_and_recover_with_num_keeping_test(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  int iVar3;
  fdb_kvs_handle *pfVar4;
  size_t sVar5;
  fdb_kvs_handle *pfVar6;
  char *pcVar7;
  fdb_kvs_handle *pfVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  fdb_doc **doc;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  fdb_kvs_handle *pfVar15;
  ulong uVar16;
  fdb_kvs_handle **__s;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_kvs_info kvs_info;
  char bodybuf [512];
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_17a0;
  fdb_file_handle *pfStackY_1798;
  fdb_kvs_config fStackY_1790;
  char acStackY_1778 [264];
  fdb_config fStackY_1670;
  char acStackY_1578 [520];
  fdb_doc **ppfStackY_1370;
  size_t sStackY_1360;
  char *pcStackY_1358;
  char *pcStackY_1350;
  code *pcStackY_1348;
  fdb_kvs_handle *pfStack_1338;
  fdb_file_handle *pfStack_1330;
  fdb_iterator *pfStack_1328;
  fdb_doc *pfStack_1320;
  fdb_kvs_handle *pfStack_1318;
  timeval tStack_1310;
  char acStack_1300 [512];
  fdb_kvs_config fStack_1100;
  fdb_file_info fStack_10e8;
  char acStack_10a0 [256];
  fdb_config fStack_fa0;
  char *pcStack_ea8;
  fdb_kvs_handle *pfStack_ea0;
  fdb_kvs_handle *pfStack_e98;
  fdb_kvs_handle *pfStack_e90;
  fdb_kvs_handle *pfStack_e88;
  fdb_kvs_handle *pfStack_e80;
  fdb_kvs_handle *pfStack_e70;
  fdb_file_handle *pfStack_e68;
  uint uStack_e5c;
  fdb_kvs_info fStack_e58;
  timeval tStack_e28;
  fdb_kvs_config fStack_e18;
  undefined1 auStack_e00 [80];
  docio_handle *pdStack_db0;
  btreeblk_handle *pbStack_da8;
  btree_blk_ops *pbStack_da0;
  filemgr_ops *pfStack_d98;
  fdb_config fStack_d90;
  undefined1 uStack_bb9;
  fdb_kvs_handle fStack_bb8;
  fdb_kvs_handle *pfStack_9b0;
  char *pcStack_9a8;
  char *pcStack_9a0;
  fdb_kvs_handle *pfStack_998;
  fdb_kvs_handle *pfStack_990;
  fdb_file_handle *pfStack_988;
  timeval tStack_980;
  undefined1 auStack_970 [536];
  undefined1 auStack_758 [375];
  undefined1 uStack_5e1;
  fdb_kvs_handle *pfStack_558;
  undefined8 uStack_540;
  fdb_kvs_handle *pfStack_518;
  fdb_kvs_handle *pfStack_510;
  fdb_kvs_handle *pfStack_508;
  fdb_kvs_handle **ppfStack_500;
  fdb_kvs_handle *pfStack_4f8;
  fdb_kvs_handle *pfStack_4f0;
  fdb_kvs_handle *local_4e8;
  fdb_file_handle *local_4e0;
  fdb_kvs_handle *local_4d8;
  fdb_kvs_handle *local_4d0;
  fdb_kvs_config local_4c8;
  timeval local_4b0;
  fdb_file_info local_4a0;
  fdb_kvs_info local_458;
  fdb_kvs_handle local_428;
  fdb_config local_128;
  
  pfStack_4f0 = (fdb_kvs_handle *)0x10d4c6;
  gettimeofday(&local_4b0,(__timezone_ptr_t)0x0);
  pfStack_4f0 = (fdb_kvs_handle *)0x10d4cb;
  memleak_start();
  pfStack_4f0 = (fdb_kvs_handle *)0x10d4d8;
  fdb_get_default_kvs_config();
  pfStack_4f0 = (fdb_kvs_handle *)0x10d4e8;
  fdb_get_default_config();
  local_128.compaction_threshold = '\0';
  local_128.block_reusing_threshold = 0x41;
  local_128.num_keeping_headers = 10;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d50f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_4f0 = (fdb_kvs_handle *)0x10d526;
  fdb_open(&local_4e0,"./staleblktest1file.1",&local_128);
  pfStack_4f0 = (fdb_kvs_handle *)0x10d53b;
  fdb_kvs_open(local_4e0,&local_4e8,"./staleblktest1",&local_4c8);
  pcVar10 = "%dkey";
  __s = &local_428.bub_ctx.handle;
  pfVar8 = &local_428;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_4f0 = (fdb_kvs_handle *)0x10d563;
    sprintf((char *)__s,"%dkey",pfVar15);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d575;
    memset(pfVar8,0x62,0x1ff);
    pfVar6 = local_4e8;
    local_428.bub_ctx.space_used._7_1_ = 0;
    pfStack_4f0 = (fdb_kvs_handle *)0x10d589;
    pfVar4 = (fdb_kvs_handle *)strlen((char *)__s);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d594;
    sVar5 = strlen((char *)pfVar8);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d5a8;
    fVar1 = fdb_set_kv(pfVar6,__s,(size_t)pfVar4,pfVar8,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010da08:
      pfStack_4f0 = (fdb_kvs_handle *)0x10da0f;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da0f;
    }
    pfStack_4f0 = (fdb_kvs_handle *)0x10d5bf;
    fVar1 = fdb_commit(local_4e0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_4f0 = (fdb_kvs_handle *)0x10da08;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da08;
    }
    uVar12 = (int)pfVar15 + 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pfVar8 = (fdb_kvs_handle *)0x0;
  pcVar10 = (char *)&local_428.bub_ctx.handle;
  pfVar15 = &local_428;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pfVar6 = local_4e8;
    local_428.bub_ctx.handle._4_1_ = 0;
    local_428.bub_ctx.handle._0_4_ = 0x79656b30;
    local_428.kvs_config.create_if_missing = true;
    local_428.kvs_config._1_7_ = 0x63636363636363;
    local_428.kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x6363636363636363;
    local_428.kvs_config.custom_cmp_param = (void *)0x6363636363636363;
    local_428.kvs = (kvs_info *)0x6363636363636363;
    local_428.op_stats = (kvs_ops_stat *)0x6363636363636363;
    local_428.fhandle._0_7_ = 0x63636363636363;
    local_428.fhandle._7_1_ = 99;
    local_428.trie._0_7_ = 0x63636363636363;
    local_428.trie._7_1_ = 99;
    local_428.staletree._0_7_ = 0x63636363636363;
    local_428.staletree._7_1_ = 99;
    local_428.field_6.seqtree = (btree *)0x6363636363636363;
    local_428.file = (filemgr *)0x6363636363636363;
    local_428.dhandle = (docio_handle *)0x6363636363636363;
    local_428.bhandle = (btreeblk_handle *)0x6363636363636363;
    local_428.btreeblkops = (btree_blk_ops *)0x6363636363636363;
    local_428.fileops._0_7_ = 0x63636363636363;
    local_428.fileops._7_1_ = 99;
    local_428.config._0_7_ = 0x63636363636363;
    local_428.config._7_8_ = 0x6363636363636363;
    local_428.config.buffercache_size._7_1_ = 0;
    pfStack_4f0 = (fdb_kvs_handle *)0x10d652;
    pfVar4 = (fdb_kvs_handle *)strlen(pcVar10);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d65d;
    sVar5 = strlen((char *)pfVar15);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d671;
    fVar1 = fdb_set_kv(pfVar6,pcVar10,(size_t)pfVar4,pfVar15,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da16;
    pfStack_4f0 = (fdb_kvs_handle *)0x10d688;
    fVar1 = fdb_get_file_info(local_4e0,&local_4a0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da0f;
    __s = (fdb_kvs_handle **)(ulong)((int)__s + 1);
  } while (local_4a0.file_size < 0x1000000);
  pfStack_4f0 = (fdb_kvs_handle *)0x10d6ab;
  sVar2 = sb_check_block_reusing(local_4e8);
  if (sVar2 != SBD_RECLAIM) goto LAB_0010da40;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d6c3;
  fVar1 = fdb_commit(local_4e0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da45;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d6dc;
  fVar1 = fdb_get_kvs_info(local_4e8,&local_458);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da4c;
  local_4d8 = (fdb_kvs_handle *)local_458.last_seqnum;
  pfVar8 = (fdb_kvs_handle *)&local_428.bub_ctx.handle;
  pfVar6 = &local_428;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_4f0 = (fdb_kvs_handle *)0x10d716;
    sprintf((char *)pfVar8,"%dkey",pfVar15);
    pfVar4 = local_4e8;
    local_428.kvs_config.create_if_missing = true;
    local_428.kvs_config._1_7_ = 0x64646464646464;
    local_428.kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x6464646464646464;
    local_428.kvs_config.custom_cmp_param = (void *)0x6464646464646464;
    local_428.kvs = (kvs_info *)0x6464646464646464;
    local_428.op_stats = (kvs_ops_stat *)0x6464646464646464;
    local_428.fhandle._0_7_ = 0x64646464646464;
    local_428.fhandle._7_1_ = 100;
    local_428.trie._0_7_ = 0x64646464646464;
    local_428.trie._7_1_ = 100;
    local_428.staletree._0_7_ = 0x64646464646464;
    local_428.staletree._7_1_ = 0;
    pfStack_4f0 = (fdb_kvs_handle *)0x10d751;
    pcVar10 = (char *)strlen((char *)pfVar8);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d75c;
    sVar5 = strlen((char *)pfVar6);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d770;
    fVar1 = fdb_set_kv(pfVar4,pfVar8,(size_t)pcVar10,pfVar6,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da24;
    pfStack_4f0 = (fdb_kvs_handle *)0x10d787;
    fVar1 = fdb_commit(local_4e0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da1d;
    uVar12 = (int)pfVar15 + 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
  } while (uVar12 != 10);
  pfStack_4f0 = (fdb_kvs_handle *)0x10d7a3;
  fVar1 = fdb_kvs_close(local_4e8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da53;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d7b5;
  fVar1 = fdb_close(local_4e0);
  pcVar10 = (char *)local_4d8;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da5a;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d7c7;
  fdb_shutdown();
  pfStack_4f0 = (fdb_kvs_handle *)0x10d7e0;
  fVar1 = fdb_open(&local_4e0,"./staleblktest1file.1",&local_128);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da61;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d801;
  fdb_kvs_open(local_4e0,&local_4e8,"./staleblktest1",&local_4c8);
  pfStack_4f0 = (fdb_kvs_handle *)0x10d810;
  fVar1 = fdb_get_file_info(local_4e0,&local_4a0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da68;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d838;
  iVar3 = _disk_dump("./staleblktest1file.1",local_4a0.file_size,
                     (ulong)((local_128.blocksize >> 2) + local_128.blocksize * 2));
  if (iVar3 < 0) goto LAB_0010da6f;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d851;
  fVar1 = fdb_snapshot_open(local_4e8,&local_4d0,(fdb_seqnum_t)pcVar10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da74;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d864;
  fVar1 = fdb_rollback(&local_4e8,(fdb_seqnum_t)pcVar10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da7b;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d87d;
  fVar1 = fdb_compact(local_4e0,"./staleblktest1file.3");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da82;
  pcVar10 = "%dkey";
  pfVar6 = (fdb_kvs_handle *)&local_428.bub_ctx.handle;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_4f0 = (fdb_kvs_handle *)0x10d8a5;
    sprintf((char *)pfVar6,"%dkey",pfVar15);
    pfVar8 = local_4e8;
    pfStack_4f0 = (fdb_kvs_handle *)0x10d8b1;
    sVar5 = strlen((char *)pfVar6);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d8bf;
    fVar1 = fdb_del_kv(pfVar8,pfVar6,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da32;
    pfStack_4f0 = (fdb_kvs_handle *)0x10d8d6;
    fVar1 = fdb_commit(local_4e0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da2b;
    uVar12 = (int)pfVar15 + 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pfStack_4f0 = (fdb_kvs_handle *)0x10d8ee;
  sVar2 = sb_check_block_reusing(local_4e8);
  if (sVar2 != SBD_NONE) goto LAB_0010da89;
  pfVar15 = (fdb_kvs_handle *)0x0;
  pcVar10 = (char *)&local_428;
  pfVar4 = (fdb_kvs_handle *)&local_428.bub_ctx.handle;
  do {
    local_428.bub_ctx.handle._4_1_ = 0;
    local_428.bub_ctx.handle._0_4_ = 0x79656b30;
    pfStack_4f0 = (fdb_kvs_handle *)0x10d92d;
    memset(pcVar10,0x65,0x1ff);
    pfVar8 = local_4e8;
    local_428.bub_ctx.space_used._7_1_ = 0;
    pfStack_4f0 = (fdb_kvs_handle *)0x10d941;
    pfVar6 = (fdb_kvs_handle *)strlen((char *)pfVar4);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d94c;
    sVar5 = strlen(pcVar10);
    pfStack_4f0 = (fdb_kvs_handle *)0x10d960;
    fVar1 = fdb_set_kv(pfVar8,pfVar4,(size_t)pfVar6,pcVar10,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da39;
    uVar12 = (int)__s - 1;
    __s = (fdb_kvs_handle **)(ulong)uVar12;
  } while (uVar12 != 0);
  pfStack_4f0 = (fdb_kvs_handle *)0x10d976;
  sVar2 = sb_check_block_reusing(local_4e8);
  if (sVar2 != SBD_RECLAIM) goto LAB_0010da8e;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d989;
  fVar1 = fdb_kvs_close(local_4d0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da93;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d99a;
  fVar1 = fdb_kvs_close(local_4e8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da9a;
  pfStack_4f0 = (fdb_kvs_handle *)0x10d9ac;
  fVar1 = fdb_close(local_4e0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_4f0 = (fdb_kvs_handle *)0x10d9b9;
    fdb_shutdown();
    pfStack_4f0 = (fdb_kvs_handle *)0x10d9be;
    memleak_end();
    pcVar10 = "%s PASSED\n";
    if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
      pcVar10 = "%s FAILED\n";
    }
    pfStack_4f0 = (fdb_kvs_handle *)0x10d9ef;
    fprintf(_stderr,pcVar10,"crash and recover with num keeping test");
    return;
  }
  goto LAB_0010daa1;
LAB_0010da0f:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da16;
  crash_and_recover_with_num_keeping_test();
LAB_0010da16:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da1d;
  crash_and_recover_with_num_keeping_test();
LAB_0010da1d:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da24;
  crash_and_recover_with_num_keeping_test();
LAB_0010da24:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da2b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da2b:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da32;
  crash_and_recover_with_num_keeping_test();
LAB_0010da32:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da39;
  crash_and_recover_with_num_keeping_test();
LAB_0010da39:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da40;
  crash_and_recover_with_num_keeping_test();
LAB_0010da40:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da45;
  crash_and_recover_with_num_keeping_test();
LAB_0010da45:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da4c;
  crash_and_recover_with_num_keeping_test();
LAB_0010da4c:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da53;
  crash_and_recover_with_num_keeping_test();
LAB_0010da53:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da5a;
  crash_and_recover_with_num_keeping_test();
LAB_0010da5a:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da61;
  crash_and_recover_with_num_keeping_test();
LAB_0010da61:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da68;
  crash_and_recover_with_num_keeping_test();
LAB_0010da68:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da6f;
  crash_and_recover_with_num_keeping_test();
LAB_0010da6f:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da74;
  crash_and_recover_with_num_keeping_test();
LAB_0010da74:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da7b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da7b:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da82;
  crash_and_recover_with_num_keeping_test();
LAB_0010da82:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da89;
  crash_and_recover_with_num_keeping_test();
LAB_0010da89:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da8e;
  crash_and_recover_with_num_keeping_test();
LAB_0010da8e:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da93;
  crash_and_recover_with_num_keeping_test();
LAB_0010da93:
  pfStack_4f0 = (fdb_kvs_handle *)0x10da9a;
  crash_and_recover_with_num_keeping_test();
LAB_0010da9a:
  pfStack_4f0 = (fdb_kvs_handle *)0x10daa1;
  crash_and_recover_with_num_keeping_test();
LAB_0010daa1:
  pfStack_4f0 = (fdb_kvs_handle *)reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_998 = (fdb_kvs_handle *)0x10dac5;
  pfStack_518 = (fdb_kvs_handle *)pcVar10;
  pfStack_510 = pfVar6;
  pfStack_508 = pfVar4;
  ppfStack_500 = __s;
  pfStack_4f8 = pfVar8;
  pfStack_4f0 = pfVar15;
  gettimeofday(&tStack_980,(__timezone_ptr_t)0x0);
  pfStack_998 = (fdb_kvs_handle *)0x10daca;
  memleak_start();
  pfStack_998 = (fdb_kvs_handle *)0x10dada;
  fdb_get_default_kvs_config();
  pfStack_998 = (fdb_kvs_handle *)0x10daea;
  fdb_get_default_config();
  uStack_5e1 = 0;
  pfStack_558 = (fdb_kvs_handle *)0x41;
  uStack_540 = 10;
  pfStack_998 = (fdb_kvs_handle *)0x10db11;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_998 = (fdb_kvs_handle *)0x10db28;
  fdb_open(&pfStack_988,"./staleblktest1",(fdb_config *)(auStack_758 + 0x148));
  pfStack_998 = (fdb_kvs_handle *)0x10db36;
  fdb_kvs_open_default(pfStack_988,&pfStack_990,(fdb_kvs_config *)(auStack_970 + 0x200));
  pcVar11 = "%dkey";
  pcVar7 = auStack_758 + 0x48;
  pcVar10 = auStack_970;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_998 = (fdb_kvs_handle *)0x10db5b;
    sprintf(pcVar7,"%dkey",pfVar15);
    pfStack_998 = (fdb_kvs_handle *)0x10db6d;
    memset(pcVar10,0x62,0x1ff);
    pfVar8 = pfStack_990;
    auStack_970[0x1ff] = 0;
    pfStack_998 = (fdb_kvs_handle *)0x10db81;
    pfVar6 = (fdb_kvs_handle *)strlen(pcVar7);
    pfStack_998 = (fdb_kvs_handle *)0x10db8c;
    sVar5 = strlen(pcVar10);
    pfStack_998 = (fdb_kvs_handle *)0x10dba0;
    fVar1 = fdb_set_kv(pfVar8,pcVar7,(size_t)pfVar6,pcVar10,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010de39:
      pfStack_998 = (fdb_kvs_handle *)0x10de40;
      reuse_on_delete_test();
      goto LAB_0010de40;
    }
    pfStack_998 = (fdb_kvs_handle *)0x10dbb7;
    fVar1 = fdb_commit(pfStack_988,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_998 = (fdb_kvs_handle *)0x10de39;
      reuse_on_delete_test();
      goto LAB_0010de39;
    }
    uVar12 = (int)pfVar15 + 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pcVar10 = auStack_758 + 0x48;
  pfVar8 = (fdb_kvs_handle *)auStack_970;
  pfVar6 = (fdb_kvs_handle *)auStack_758;
  pcVar11 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar4 = (fdb_kvs_handle *)pcVar11;
    pfStack_998 = (fdb_kvs_handle *)0x10dbf0;
    sprintf(pcVar10,"%dkey",pfVar4);
    pfVar15 = pfStack_990;
    auStack_970._0_8_ = 0x6363636363636363;
    auStack_970._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_970._16_8_ = (void *)0x6363636363636363;
    auStack_970._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_970._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_970._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_970._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_970._56_8_ = (btree *)0x6363636363636363;
    auStack_970._64_8_ = (btree *)0x6363636363636363;
    auStack_970._72_8_ = (filemgr *)0x6363636363636363;
    auStack_970._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_970._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_970._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_970._104_7_ = 0x63636363636363;
    auStack_970[0x6f] = 99;
    auStack_970._112_7_ = 0x63636363636363;
    auStack_970._119_8_ = 0x6363636363636363;
    auStack_970[0x7f] = 0;
    pfStack_998 = (fdb_kvs_handle *)0x10dc39;
    pcVar7 = (char *)strlen(pcVar10);
    pfStack_998 = (fdb_kvs_handle *)0x10dc44;
    sVar5 = strlen((char *)pfVar8);
    pfStack_998 = (fdb_kvs_handle *)0x10dc58;
    fVar1 = fdb_set_kv(pfVar15,pcVar10,(size_t)pcVar7,pfVar8,sVar5);
    pcVar11 = (char *)pfVar4;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de47;
    pfStack_998 = (fdb_kvs_handle *)0x10dc6d;
    fVar1 = fdb_get_file_info(pfStack_988,(fdb_file_info *)pfVar6);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de40;
    uVar12 = (uint)pfVar4 + 1;
    pcVar11 = (char *)(ulong)uVar12;
  } while ((ulong)auStack_758._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_998 = (fdb_kvs_handle *)0x10dc92;
  sVar2 = sb_check_block_reusing(pfStack_990);
  if (sVar2 == SBD_NONE) {
    pfStack_998 = (fdb_kvs_handle *)0x10dca9;
    fVar1 = fdb_commit(pfStack_988,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de61;
    pcVar7 = "%dkey";
    pcVar10 = auStack_758 + 0x48;
    pfVar15 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_998 = (fdb_kvs_handle *)0x10dcd5;
      sprintf(pcVar10,"%dkey",pfVar15);
      pfVar8 = pfStack_990;
      pfStack_998 = (fdb_kvs_handle *)0x10dce1;
      sVar5 = strlen(pcVar10);
      pfStack_998 = (fdb_kvs_handle *)0x10dcef;
      fVar1 = fdb_del_kv(pfVar8,pcVar10,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de4e;
      uVar13 = (int)pfVar15 + 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
    } while (uVar12 != uVar13);
    pfStack_998 = (fdb_kvs_handle *)0x10dd06;
    sVar2 = sb_check_block_reusing(pfStack_990);
    if (sVar2 != SBD_RECLAIM) goto LAB_0010de68;
    if (2 < (uint)pfVar4) {
      pcVar11 = (char *)(ulong)(uVar12 >> 2);
      pcVar10 = auStack_758 + 0x48;
      pfVar8 = (fdb_kvs_handle *)auStack_970;
      pfVar15 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_998 = (fdb_kvs_handle *)0x10dd3e;
        sprintf(pcVar10,"%dkey",pfVar15);
        pfVar4 = pfStack_990;
        auStack_970._0_8_ = 0x6464646464646464;
        auStack_970._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_970._16_8_ = (void *)0x6464646464646464;
        auStack_970._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_970._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_970._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_970._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_970._56_8_ = (btree *)0x6464646464646464;
        auStack_970._64_8_ = (btree *)0x6464646464646464;
        auStack_970._72_8_ = (filemgr *)0x6464646464646464;
        auStack_970._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_970._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_970._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_970._104_7_ = 0x64646464646464;
        auStack_970[0x6f] = 100;
        auStack_970._112_7_ = 0x64646464646464;
        auStack_970._119_8_ = 0x6464646464646464;
        auStack_970[0x7f] = 0;
        pfStack_998 = (fdb_kvs_handle *)0x10dd87;
        pcVar7 = (char *)strlen(pcVar10);
        pfStack_998 = (fdb_kvs_handle *)0x10dd92;
        sVar5 = strlen((char *)pfVar8);
        pfStack_998 = (fdb_kvs_handle *)0x10dda6;
        fVar1 = fdb_set_kv(pfVar4,pcVar10,(size_t)pcVar7,pfVar8,sVar5);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de55;
        uVar13 = (int)pfVar15 + 2;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
      } while (uVar13 < uVar12 >> 2);
    }
    pcVar10 = auStack_758 + 0x48;
    pfStack_998 = (fdb_kvs_handle *)0x10ddc2;
    sVar2 = sb_check_block_reusing(pfStack_990);
    if (sVar2 != SBD_RECLAIM) goto LAB_0010de6d;
    pfStack_998 = (fdb_kvs_handle *)0x10ddd5;
    fVar1 = fdb_close(pfStack_988);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de72;
    pfStack_998 = (fdb_kvs_handle *)0x10dde2;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_998 = (fdb_kvs_handle *)0x10ddef;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pfStack_998 = (fdb_kvs_handle *)0x10de20;
      fprintf(_stderr,pcVar10,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de5c:
    pfStack_998 = (fdb_kvs_handle *)0x10de61;
    reuse_on_delete_test();
LAB_0010de61:
    pfVar4 = pfVar6;
    pfStack_998 = (fdb_kvs_handle *)0x10de68;
    reuse_on_delete_test();
LAB_0010de68:
    pfStack_998 = (fdb_kvs_handle *)0x10de6d;
    reuse_on_delete_test();
LAB_0010de6d:
    pfStack_998 = (fdb_kvs_handle *)0x10de72;
    reuse_on_delete_test();
LAB_0010de72:
    pfStack_998 = (fdb_kvs_handle *)0x10de79;
    reuse_on_delete_test();
  }
  pfStack_998 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_e80 = (fdb_kvs_handle *)0x10de9d;
  fStack_bb8.bub_ctx.space_used = (uint64_t)pcVar11;
  fStack_bb8.bub_ctx.handle = pfVar8;
  pfStack_9b0 = pfVar4;
  pcStack_9a8 = pcVar7;
  pcStack_9a0 = pcVar10;
  pfStack_998 = pfVar15;
  gettimeofday(&tStack_e28,(__timezone_ptr_t)0x0);
  pfStack_e80 = (fdb_kvs_handle *)0x10dea2;
  memleak_start();
  pfStack_e80 = (fdb_kvs_handle *)0x10deaf;
  fdb_get_default_kvs_config();
  pfStack_e80 = (fdb_kvs_handle *)0x10debf;
  fdb_get_default_config();
  fStack_bb8.config.block_reusing_threshold._7_1_ = 0;
  fStack_bb8.max_seqnum = 0x23;
  fStack_bb8.handle_busy.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0xa
  ;
  fStack_bb8.dirty_updates = '\0';
  fStack_bb8._466_6_ = 0;
  pfStack_e80 = (fdb_kvs_handle *)0x10dee6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_e80 = (fdb_kvs_handle *)0x10defd;
  fdb_open(&pfStack_e68,"./staleblktest1",(fdb_config *)&fStack_bb8.config.encryption_key);
  pfStack_e80 = (fdb_kvs_handle *)0x10df0d;
  fdb_kvs_open_default(pfStack_e68,&pfStack_e70,&fStack_e18);
  pcVar11 = "%dkey";
  pcVar10 = (char *)&fStack_bb8;
  pcVar7 = auStack_e00 + 0x48;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_e80 = (fdb_kvs_handle *)0x10df35;
    sprintf(pcVar10,"%dkey",pfVar15);
    pfStack_e80 = (fdb_kvs_handle *)0x10df47;
    memset(pcVar7,0x61,0x1ff);
    pfVar6 = pfStack_e70;
    uStack_bb9 = 0;
    pfStack_e80 = (fdb_kvs_handle *)0x10df5c;
    pfVar8 = (fdb_kvs_handle *)strlen(pcVar10);
    pfStack_e80 = (fdb_kvs_handle *)0x10df67;
    sVar5 = strlen(pcVar7);
    pfStack_e80 = (fdb_kvs_handle *)0x10df7b;
    fVar1 = fdb_set_kv(pfVar6,pcVar10,(size_t)pfVar8,pcVar7,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010e2e3:
      pfStack_e80 = (fdb_kvs_handle *)0x10e2ea;
      fragmented_reuse_test();
      goto LAB_0010e2ea;
    }
    pfStack_e80 = (fdb_kvs_handle *)0x10df92;
    fVar1 = fdb_commit(pfStack_e68,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_e80 = (fdb_kvs_handle *)0x10e2e3;
      fragmented_reuse_test();
      goto LAB_0010e2e3;
    }
    uVar12 = (int)pfVar15 + 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pcVar7 = (char *)&fStack_bb8;
  pfVar6 = (fdb_kvs_handle *)(auStack_e00 + 0x48);
  pfVar8 = (fdb_kvs_handle *)auStack_e00;
  pcVar11 = (char *)0x0;
  do {
    uVar12 = (uint)pcVar11;
    pfStack_e80 = (fdb_kvs_handle *)0x10dfcb;
    sprintf(pcVar7,"%dkey",pcVar11);
    pfVar15 = pfStack_e70;
    auStack_e00._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_db0 = (docio_handle *)0x6262626262626262;
    pbStack_da8 = (btreeblk_handle *)0x6262626262626262;
    pbStack_da0 = (btree_blk_ops *)0x6262626262626262;
    pfStack_d98 = (filemgr_ops *)0x6262626262626262;
    fStack_d90.chunksize = 0x6262;
    fStack_d90._2_2_ = 0x6262;
    fStack_d90.blocksize = 0x62626262;
    fStack_d90.buffercache_size = 0x6262626262626262;
    fStack_d90.wal_threshold = 0x6262626262626262;
    fStack_d90.wal_flush_before_commit = true;
    fStack_d90.auto_commit = true;
    fStack_d90._26_2_ = 0x6262;
    fStack_d90.purging_interval = 0x62626262;
    fStack_d90.seqtree_opt = 'b';
    fStack_d90.durability_opt = 'b';
    fStack_d90._34_2_ = 0x6262;
    fStack_d90.flags = 0x62626262;
    fStack_d90.compaction_buf_maxsize = 0x62626262;
    fStack_d90.cleanup_cache_onclose = true;
    fStack_d90.compress_document_body = true;
    fStack_d90.compaction_mode = 'b';
    fStack_d90.compaction_threshold = 'b';
    fStack_d90.compaction_minimum_filesize = 0x6262626262626262;
    fStack_d90.compactor_sleep_duration = 0x6262626262626262;
    fStack_d90.multi_kv_instances = true;
    fStack_d90._65_6_ = 0x626262626262;
    fStack_d90._71_1_ = 0x62;
    fStack_d90.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_d90._79_8_ = 0x6262626262626262;
    fStack_d90._87_1_ = 0;
    pfStack_e80 = (fdb_kvs_handle *)0x10e027;
    pcVar10 = (char *)strlen(pcVar7);
    pfStack_e80 = (fdb_kvs_handle *)0x10e032;
    sVar5 = strlen((char *)pfVar6);
    pfStack_e80 = (fdb_kvs_handle *)0x10e046;
    fVar1 = fdb_set_kv(pfVar15,pcVar7,(size_t)pcVar10,pfVar6,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2f1;
    pfStack_e80 = (fdb_kvs_handle *)0x10e05b;
    fVar1 = fdb_get_file_info(pfStack_e68,(fdb_file_info *)pfVar8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2ea;
    uVar13 = uVar12 + 1;
    pcVar11 = (char *)(ulong)uVar13;
  } while ((ulong)auStack_e00._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_e5c = uVar12;
  if (2 < uVar12) {
    uVar12 = (uVar13 >> 2) + (uint)(uVar13 >> 2 == 0);
    pfVar8 = (fdb_kvs_handle *)(ulong)uVar12;
    pcVar10 = "%dkey";
    pcVar7 = (char *)&fStack_bb8;
    pfVar15 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_e80 = (fdb_kvs_handle *)0x10e0b2;
      sprintf(pcVar7,"%dkey",pfVar15);
      pfVar6 = pfStack_e70;
      pfStack_e80 = (fdb_kvs_handle *)0x10e0bf;
      sVar5 = strlen(pcVar7);
      pfStack_e80 = (fdb_kvs_handle *)0x10e0cd;
      fVar1 = fdb_del_kv(pfVar6,pcVar7,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2ff;
      uVar14 = (int)pfVar15 + 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar14;
    } while (uVar12 != uVar14);
  }
  pcVar7 = (char *)&fStack_bb8;
  pfStack_e80 = (fdb_kvs_handle *)0x10e0e6;
  sVar2 = sb_check_block_reusing(pfStack_e70);
  if (sVar2 == SBD_NONE) {
    pcVar7 = (char *)(pfStack_e70->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_e80 = (fdb_kvs_handle *)0x10e10c;
    fVar1 = fdb_compact(pfStack_e68,"staleblktest_compact");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e319;
    pfStack_e80 = (fdb_kvs_handle *)0x10e123;
    fVar1 = fdb_get_kvs_info(pfStack_e70,&fStack_e58);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e320;
    if (fStack_e58.doc_count == 0) {
      pfStack_e80 = (fdb_kvs_handle *)0x10e13d;
      fragmented_reuse_test();
    }
    pcVar10 = (char *)(ulong)(uVar13 >> 2);
    if (pcVar7 <= (fdb_kvs_handle *)(pfStack_e70->file->pos).super___atomic_base<unsigned_long>._M_i
       ) {
      pfStack_e80 = (fdb_kvs_handle *)0x10e163;
      fragmented_reuse_test();
    }
    uVar12 = uVar13 >> 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
    if (uVar13 >> 2 < uVar12) {
      pcVar7 = "%dkey";
      pfVar6 = &fStack_bb8;
      do {
        pfStack_e80 = (fdb_kvs_handle *)0x10e18b;
        sprintf((char *)pfVar6,"%dkey",pcVar10);
        pfVar8 = pfStack_e70;
        pfStack_e80 = (fdb_kvs_handle *)0x10e198;
        sVar5 = strlen((char *)pfVar6);
        pfStack_e80 = (fdb_kvs_handle *)0x10e1a6;
        fVar1 = fdb_del_kv(pfVar8,pfVar6,sVar5);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e306;
        uVar14 = (int)pcVar10 + 1;
        pcVar10 = (char *)(ulong)uVar14;
      } while (uVar14 < uVar12);
    }
    pfStack_e80 = (fdb_kvs_handle *)0x10e1c0;
    sVar2 = sb_check_block_reusing(pfStack_e70);
    if (sVar2 != SBD_NONE) goto LAB_0010e327;
    if (uVar12 <= uStack_e5c) {
      pcVar10 = "%dkey";
      pcVar7 = (char *)&fStack_bb8;
      do {
        pfStack_e80 = (fdb_kvs_handle *)0x10e1ec;
        sprintf(pcVar7,"%dkey",pfVar15);
        pfVar6 = pfStack_e70;
        pfStack_e80 = (fdb_kvs_handle *)0x10e1f9;
        sVar5 = strlen(pcVar7);
        pfStack_e80 = (fdb_kvs_handle *)0x10e207;
        fVar1 = fdb_del_kv(pfVar6,pcVar7,sVar5);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e30d;
        uVar12 = (int)pfVar15 + 1;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
      } while (uVar13 != uVar12);
    }
    pcVar11 = (char *)0xb;
    do {
      pfStack_e80 = (fdb_kvs_handle *)0x10e229;
      fVar1 = fdb_commit(pfStack_e68,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2f8;
      uVar12 = (int)pcVar11 - 1;
      pcVar11 = (char *)(ulong)uVar12;
    } while (uVar12 != 0);
    pfStack_e80 = (fdb_kvs_handle *)0x10e244;
    fVar1 = fdb_get_kvs_info(pfStack_e70,&fStack_e58);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e32c;
    pfStack_e80 = (fdb_kvs_handle *)0x10e256;
    sVar2 = sb_check_block_reusing(pfStack_e70);
    if (sVar2 == SBD_NONE) goto LAB_0010e333;
    pfStack_e80 = (fdb_kvs_handle *)0x10e26d;
    fVar1 = fdb_commit(pfStack_e68,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e338;
    pfStack_e80 = (fdb_kvs_handle *)0x10e27f;
    fVar1 = fdb_close(pfStack_e68);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e33f;
    pfStack_e80 = (fdb_kvs_handle *)0x10e28c;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_e80 = (fdb_kvs_handle *)0x10e299;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pfStack_e80 = (fdb_kvs_handle *)0x10e2ca;
      fprintf(_stderr,pcVar10,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e314:
    pfStack_e80 = (fdb_kvs_handle *)0x10e319;
    fragmented_reuse_test();
LAB_0010e319:
    pfStack_e80 = (fdb_kvs_handle *)0x10e320;
    fragmented_reuse_test();
LAB_0010e320:
    pfStack_e80 = (fdb_kvs_handle *)0x10e327;
    fragmented_reuse_test();
LAB_0010e327:
    pfStack_e80 = (fdb_kvs_handle *)0x10e32c;
    fragmented_reuse_test();
LAB_0010e32c:
    pfStack_e80 = (fdb_kvs_handle *)0x10e333;
    fragmented_reuse_test();
LAB_0010e333:
    pfStack_e80 = (fdb_kvs_handle *)0x10e338;
    fragmented_reuse_test();
LAB_0010e338:
    pfStack_e80 = (fdb_kvs_handle *)0x10e33f;
    fragmented_reuse_test();
LAB_0010e33f:
    pfStack_e80 = (fdb_kvs_handle *)0x10e346;
    fragmented_reuse_test();
  }
  pfStack_e80 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_1348 = (code *)0x10e36a;
  pcStack_ea8 = pcVar11;
  pfStack_ea0 = pfVar6;
  pfStack_e98 = pfVar8;
  pfStack_e90 = (fdb_kvs_handle *)pcVar10;
  pfStack_e88 = (fdb_kvs_handle *)pcVar7;
  pfStack_e80 = pfVar15;
  gettimeofday(&tStack_1310,(__timezone_ptr_t)0x0);
  pcStackY_1348 = (code *)0x10e36f;
  memleak_start();
  pfStack_1320 = (fdb_doc *)0x0;
  pcStackY_1348 = (code *)0x10e388;
  fdb_get_default_kvs_config();
  pcStackY_1348 = (code *)0x10e398;
  fdb_get_default_config();
  fStack_fa0.compaction_threshold = '\0';
  fStack_fa0.block_reusing_threshold = 0x23;
  fStack_fa0.num_keeping_headers = 10;
  pcStackY_1348 = (code *)0x10e3bf;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_1348 = (code *)0x10e3d6;
  fdb_open(&pfStack_1330,"./staleblktest1",&fStack_fa0);
  pcStackY_1348 = (code *)0x10e3ed;
  fdb_kvs_open(pfStack_1330,&pfStack_1338,"db",&fStack_1100);
  pcStackY_1348 = (code *)0x10e404;
  fdb_kvs_open(pfStack_1330,&pfStack_1318,"db2",&fStack_1100);
  pcVar10 = acStack_10a0;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar7 = acStack_1300;
  pcVar11 = (char *)0x0;
  do {
    pcStackY_1348 = (code *)0x10e430;
    sprintf(pcVar10,"%dkey",pcVar11);
    pfVar15 = pfStack_1338;
    builtin_strncpy(acStack_1300,"aaaaaaaaaaa",0xc);
    pcStackY_1348 = (code *)0x10e44f;
    sVar9 = strlen(pcVar10);
    pcStackY_1348 = (code *)0x10e45a;
    sVar5 = strlen(pcVar7);
    pcStackY_1348 = (code *)0x10e46e;
    fVar1 = fdb_set_kv(pfVar15,pcVar10,sVar9,pcVar7,sVar5);
    pfVar15 = pfStack_1318;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStackY_1348 = (code *)0x10e779;
      enter_reuse_via_separate_kvs_test();
LAB_0010e779:
      pcStackY_1348 = (code *)0x10e780;
      enter_reuse_via_separate_kvs_test();
LAB_0010e780:
      pcStackY_1348 = (code *)0x10e787;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e787;
    }
    pcStackY_1348 = (code *)0x10e483;
    sVar9 = strlen(pcVar10);
    pcStackY_1348 = (code *)0x10e48e;
    sVar5 = strlen(pcVar7);
    pcStackY_1348 = (code *)0x10e4a2;
    fVar1 = fdb_set_kv(pfVar15,pcVar10,sVar9,pcVar7,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e779;
    pcStackY_1348 = (code *)0x10e4b9;
    fVar1 = fdb_commit(pfStack_1330,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e780;
    uVar12 = (int)pcVar11 + 1;
    pcVar11 = (char *)(ulong)uVar12;
  } while (uVar12 != 10);
  pcVar7 = (char *)0x0;
  pcVar11 = acStack_10a0;
  pcVar10 = acStack_1300;
  doc = (fdb_doc **)0x0;
  do {
    pfVar15 = pfStack_1338;
    builtin_strncpy(acStack_10a0,"0key",5);
    builtin_strncpy(acStack_1300,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_1348 = (code *)0x10e541;
    sVar9 = strlen(pcVar11);
    pcStackY_1348 = (code *)0x10e54c;
    sVar5 = strlen(pcVar10);
    pcStackY_1348 = (code *)0x10e560;
    fVar1 = fdb_set_kv(pfVar15,pcVar11,sVar9,pcVar10,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e78e;
    pcStackY_1348 = (code *)0x10e57a;
    fVar1 = fdb_get_file_info(pfStack_1330,&fStack_10e8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e787;
    uVar12 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar12;
  } while (fStack_10e8.file_size < 0x1000000);
  pcStackY_1348 = (code *)0x10e5a0;
  sVar2 = sb_check_block_reusing(pfStack_1338);
  if (sVar2 == SBD_RECLAIM) {
    pcStackY_1348 = (code *)0x10e5b8;
    fVar1 = fdb_commit(pfStack_1330,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e7a6;
    pcVar10 = acStack_10a0;
    pcVar7 = acStack_1300;
    pcVar11 = (char *)0x0;
    do {
      pcStackY_1348 = (code *)0x10e5e2;
      sprintf(pcVar10,"key%d",pcVar11);
      pfVar15 = pfStack_1338;
      builtin_strncpy(acStack_1300,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_1348 = (code *)0x10e632;
      sVar9 = strlen(pcVar10);
      pcStackY_1348 = (code *)0x10e63d;
      sVar5 = strlen(pcVar7);
      pcStackY_1348 = (code *)0x10e651;
      fVar1 = fdb_set_kv(pfVar15,pcVar10,sVar9,pcVar7,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e795;
      uVar13 = (int)pcVar11 + 1;
      pcVar11 = (char *)(ulong)uVar13;
    } while (uVar12 != uVar13);
    pcStackY_1348 = (code *)0x10e672;
    fVar1 = fdb_commit(pfStack_1330,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e7ad;
    pcStackY_1348 = (code *)0x10e69a;
    fdb_iterator_init(pfStack_1318,&pfStack_1328,(void *)0x0,0,(void *)0x0,0,0);
    pcVar11 = (char *)0xa;
    doc = &pfStack_1320;
    do {
      pcStackY_1348 = (code *)0x10e6b1;
      fVar1 = fdb_iterator_get(pfStack_1328,doc);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e79c;
      pcStackY_1348 = (code *)0x10e6c3;
      fdb_doc_free(pfStack_1320);
      pfStack_1320 = (fdb_doc *)0x0;
      pcStackY_1348 = (code *)0x10e6d6;
      fVar1 = fdb_iterator_next(pfStack_1328);
      uVar12 = (int)pcVar11 - 1;
      pcVar11 = (char *)(ulong)uVar12;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar12 != 0) goto LAB_0010e7b4;
    pcStackY_1348 = (code *)0x10e6ef;
    fdb_iterator_close(pfStack_1328);
    pcStackY_1348 = (code *)0x10e6f9;
    fVar1 = fdb_kvs_close(pfStack_1338);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e7b9;
    pcStackY_1348 = (code *)0x10e70b;
    fVar1 = fdb_kvs_close(pfStack_1318);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_1348 = (code *)0x10e71d;
      fVar1 = fdb_close(pfStack_1330);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcStackY_1348 = (code *)0x10e72a;
        fdb_shutdown();
        pcStackY_1348 = (code *)0x10e72f;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        pcStackY_1348 = (code *)0x10e760;
        fprintf(_stderr,pcVar10,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7c7;
    }
  }
  else {
LAB_0010e7a1:
    pcStackY_1348 = (code *)0x10e7a6;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7a6:
    pcStackY_1348 = (code *)0x10e7ad;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7ad:
    pcStackY_1348 = (code *)0x10e7b4;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b4:
    pcStackY_1348 = (code *)0x10e7b9;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b9:
    pcStackY_1348 = (code *)0x10e7c0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_1348 = (code *)0x10e7c7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7c7:
  pcStackY_1348 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_1370 = doc;
  sStackY_1360 = sVar9;
  pcStackY_1358 = pcVar10;
  pcStackY_1350 = pcVar7;
  pcStackY_1348 = (code *)pcVar11;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_1670.block_reusing_threshold = 0x41;
  fStackY_1670.num_keeping_headers = 5;
  fdb_open(&pfStackY_1798,"./staleblktest1",&fStackY_1670);
  fdb_kvs_open(pfStackY_1798,&pfStackY_17a0,"db",&fStackY_1790);
  iVar3 = 0;
  uVar16 = 0;
  do {
    sprintf(acStackY_1778,"key%d",uVar16);
    sprintf(acStackY_1578,"seqno%d",uVar16);
    pfVar15 = pfStackY_17a0;
    sVar5 = strlen(acStackY_1778);
    sVar9 = strlen(acStackY_1578);
    fdb_set_kv(pfVar15,acStackY_1778,sVar5,acStackY_1578,sVar9);
    if ((int)(uVar16 / 100) * 100 + iVar3 == 0) {
      fdb_commit(pfStackY_1798,(int)(uVar16 / 500) * 500 + iVar3 == 0);
    }
    uVar16 = (ulong)((int)uVar16 + 1);
    iVar3 = iVar3 + -1;
  } while( true );
LAB_0010de40:
  pfStack_998 = (fdb_kvs_handle *)0x10de47;
  reuse_on_delete_test();
LAB_0010de47:
  pfVar4 = pfVar6;
  pfStack_998 = (fdb_kvs_handle *)0x10de4e;
  reuse_on_delete_test();
LAB_0010de4e:
  pfStack_998 = (fdb_kvs_handle *)0x10de55;
  reuse_on_delete_test();
LAB_0010de55:
  pfStack_998 = (fdb_kvs_handle *)0x10de5c;
  reuse_on_delete_test();
  pfVar6 = pfVar4;
  goto LAB_0010de5c;
LAB_0010e2ea:
  pfStack_e80 = (fdb_kvs_handle *)0x10e2f1;
  fragmented_reuse_test();
LAB_0010e2f1:
  pfStack_e80 = (fdb_kvs_handle *)0x10e2f8;
  fragmented_reuse_test();
LAB_0010e2f8:
  pfStack_e80 = (fdb_kvs_handle *)0x10e2ff;
  fragmented_reuse_test();
LAB_0010e2ff:
  pfStack_e80 = (fdb_kvs_handle *)0x10e306;
  fragmented_reuse_test();
LAB_0010e306:
  pfStack_e80 = (fdb_kvs_handle *)0x10e30d;
  fragmented_reuse_test();
LAB_0010e30d:
  pfStack_e80 = (fdb_kvs_handle *)0x10e314;
  fragmented_reuse_test();
  goto LAB_0010e314;
LAB_0010e787:
  pcStackY_1348 = (code *)0x10e78e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e78e:
  pcStackY_1348 = (code *)0x10e795;
  enter_reuse_via_separate_kvs_test();
LAB_0010e795:
  pcStackY_1348 = (code *)0x10e79c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e79c:
  pcStackY_1348 = (code *)0x10e7a1;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e7a1;
}

Assistant:

void crash_and_recover_with_num_keeping_test() {
    TEST_INIT();
    memleak_start();

    int i, r, ndocs;
    int nheaders = 10;
    size_t last_seqno;
    char keybuf[256];
    char bodybuf[512];

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_file_info file_info;
    fdb_kvs_info kvs_info;
    sb_decision_t sb_decision;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = nheaders;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1file.1", &fconfig);
    fdb_kvs_open(dbfile, &db, "./staleblktest1", &kvs_config);

    // create num_keeping_headers+1
    for (i = 0; i < nheaders + 1; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    ndocs = i;

    // expect block reclaim
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_STATUS(status);
    last_seqno = kvs_info.last_seqnum;

    // create num_keeping_headers
    for (i = 0; i < nheaders; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 64);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // preemptive shutdown
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    // reopen
    status = fdb_open(&dbfile, "./staleblktest1file.1", &fconfig);
    TEST_STATUS(status);
    fdb_kvs_open(dbfile, &db, "./staleblktest1", &kvs_config);
    TEST_STATUS(status);

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);
    r = _disk_dump("./staleblktest1file.1", file_info.file_size,
                   (2 * fconfig.blocksize) + (fconfig.blocksize / 4));
    TEST_CHK(r >= 0);

    // snapshot to last keeping header
    status = fdb_snapshot_open(db, &snap_db, last_seqno);
    TEST_STATUS(status);

    // rollback to last keepheader
    status = fdb_rollback(&db, last_seqno);
    TEST_STATUS(status);

    // manual commit
    status = fdb_compact(dbfile, "./staleblktest1file.3");
    TEST_STATUS(status);

    // delete items
    for (i = 0; i < nheaders + 1; i++) {
        sprintf(keybuf, "%dkey",i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_STATUS(status);
        // commit
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // not reusing blocks
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_NONE);

    // append until reuse
    for (i = 0; i < ndocs; i++) {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'e', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("crash and recover with num keeping test");
}